

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

void Llb_Nonlin4CreateOrder_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Int_t *vOrder,int *pCounter)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj_01;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  int *pCounter_local;
  Vec_Int_t *vOrder_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(pAig,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(pAig,pObj);
    iVar1 = Llb_ObjBddVar(vOrder,pObj);
    if (-1 < iVar1) {
      __assert_fail("Llb_ObjBddVar(vOrder, pObj) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb4Nonlin.c"
                    ,0x115,
                    "void Llb_Nonlin4CreateOrder_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, int *)")
      ;
    }
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      pObj_00 = Aig_ObjFanin0(pObj);
      pObj_01 = Aig_ObjFanin1(pObj);
      if (((uint)((ulong)*(undefined8 *)&pObj_01->field_0x18 >> 0x20) & 0xffffff) <
          ((uint)((ulong)*(undefined8 *)&pObj_00->field_0x18 >> 0x20) & 0xffffff)) {
        Llb_Nonlin4CreateOrder_rec(pAig,pObj_00,vOrder,pCounter);
        Llb_Nonlin4CreateOrder_rec(pAig,pObj_01,vOrder,pCounter);
      }
      else {
        Llb_Nonlin4CreateOrder_rec(pAig,pObj_01,vOrder,pCounter);
        Llb_Nonlin4CreateOrder_rec(pAig,pObj_00,vOrder,pCounter);
      }
      if ((*(ulong *)&pObj->field_0x18 >> 4 & 1) != 0) {
        iVar2 = Aig_ObjId(pObj);
        iVar1 = *pCounter;
        *pCounter = iVar1 + 1;
        Vec_IntWriteEntry(vOrder,iVar2,iVar1);
      }
    }
    else {
      iVar2 = Aig_ObjId(pObj);
      iVar1 = *pCounter;
      *pCounter = iVar1 + 1;
      Vec_IntWriteEntry(vOrder,iVar2,iVar1);
    }
  }
  return;
}

Assistant:

void Llb_Nonlin4CreateOrder_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Int_t * vOrder, int * pCounter )
{
    Aig_Obj_t * pFanin0, * pFanin1;
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent( pAig, pObj );
    assert( Llb_ObjBddVar(vOrder, pObj) < 0 );
    if ( Aig_ObjIsCi(pObj) )
    {
//        if ( Saig_ObjIsLo(pAig, pObj) )
//            Vec_IntWriteEntry( vOrder, Aig_ObjId(Saig_ObjLoToLi(pAig, pObj)), (*pCounter)++ );
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), (*pCounter)++ );
        return;
    }
    // try fanins with higher level first
    pFanin0 = Aig_ObjFanin0(pObj);
    pFanin1 = Aig_ObjFanin1(pObj);
//    if ( pFanin0->Level > pFanin1->Level || (pFanin0->Level == pFanin1->Level && pFanin0->Id < pFanin1->Id) )
    if ( pFanin0->Level > pFanin1->Level )
    {
        Llb_Nonlin4CreateOrder_rec( pAig, pFanin0, vOrder, pCounter );
        Llb_Nonlin4CreateOrder_rec( pAig, pFanin1, vOrder, pCounter );
    }
    else
    {
        Llb_Nonlin4CreateOrder_rec( pAig, pFanin1, vOrder, pCounter );
        Llb_Nonlin4CreateOrder_rec( pAig, pFanin0, vOrder, pCounter );
    }
    if ( pObj->fMarkA )
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), (*pCounter)++ );
}